

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_error_code.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::signal_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int ev)

{
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"hangup",&local_9);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"interrupt",&local_9);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"quit",&local_9);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"illegal",&local_9);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"trap",&local_9);
    break;
  case 6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"abort",&local_9);
    break;
  case 7:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bus",&local_9);
    break;
  case 8:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"arithmetic_exception",&local_9);
    break;
  case 9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"kill",&local_9);
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"user1",&local_9);
    break;
  case 0xb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"segmentation fault",&local_9);
    break;
  case 0xc:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"user2",&local_9);
    break;
  case 0xd:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pipe",&local_9);
    break;
  case 0xe:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"alarm",&local_9);
    break;
  case 0xf:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminate",&local_9);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown",&local_9);
    break;
  case 0x11:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"child",&local_9);
    break;
  case 0x12:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"cont",&local_9);
    break;
  case 0x13:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"stop",&local_9);
    break;
  case 0x14:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminal_stop",&local_9);
    break;
  case 0x15:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminal_in",&local_9);
    break;
  case 0x16:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"terminal_out",&local_9);
    break;
  case 0x17:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"urgent_data",&local_9);
    break;
  case 0x18:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"cpu_limit",&local_9);
    break;
  case 0x19:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"file_size_limit",&local_9);
    break;
  case 0x1a:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"virtual_timer",&local_9);
    break;
  case 0x1b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"profiler",&local_9);
    break;
  case 0x1d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"poll",&local_9);
    break;
  case 0x1f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"system_call",&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const noexcept override
		{
#define SIGNAL_CASE(x) case sig::errors::error_code_enum:: x: return #x;
			switch (ev)
			{
			SIGNAL_CASE(abort)
			SIGNAL_CASE(alarm)
			SIGNAL_CASE(arithmetic_exception)
			SIGNAL_CASE(hangup)
			SIGNAL_CASE(illegal)
			SIGNAL_CASE(interrupt)
			SIGNAL_CASE(kill)
			SIGNAL_CASE(pipe)
			SIGNAL_CASE(quit)
			case sig::errors::error_code_enum::segmentation: return "segmentation fault";
			SIGNAL_CASE(terminate)
			SIGNAL_CASE(user1)
			SIGNAL_CASE(user2)
			SIGNAL_CASE(child)
			SIGNAL_CASE(cont)
			SIGNAL_CASE(stop)
			SIGNAL_CASE(terminal_stop)
			SIGNAL_CASE(terminal_in)
			SIGNAL_CASE(terminal_out)
			SIGNAL_CASE(bus)
#ifdef SIGPOLL
			SIGNAL_CASE(poll)
#endif
			SIGNAL_CASE(profiler)
			SIGNAL_CASE(system_call)
			SIGNAL_CASE(trap)
			SIGNAL_CASE(urgent_data)
			SIGNAL_CASE(virtual_timer)
			SIGNAL_CASE(cpu_limit)
			SIGNAL_CASE(file_size_limit)
			default: return "unknown";
			}
#undef SIGNAL_CASE
		}